

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_simple_key<std::vector<char,std::allocator<char>>>
          (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  undefined8 uVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  location<std::vector<char,_std::allocator<char>_>_> *loc_01;
  detail *pdVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  *ctx;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> bare
  ;
  value_type reg;
  result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bstr;
  allocator_type local_1e9;
  string local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  region<std::vector<char,_std::allocator<char>_>_> local_1a8;
  region<std::vector<char,_std::allocator<char>_>_> local_160;
  undefined1 local_118 [8];
  undefined1 local_110 [112];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  pdVar8 = this;
  parse_basic_string<std::vector<char,std::allocator<char>>>
            ((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_118,this,loc);
  if (local_118[0] == true) {
    pvVar5 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_118);
    pvVar6 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_118);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_1c8,&(pvVar5->first).str,&pvVar6->second);
  }
  else {
    result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_118,(EVP_PKEY_CTX *)pdVar8);
    pdVar8 = this;
    parse_literal_string<std::vector<char,std::allocator<char>>>
              ((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118,this,loc_00);
    if (local_118[0] != true) {
      result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_118,(EVP_PKEY_CTX *)pdVar8);
      repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>
      ::invoke<std::vector<char,std::allocator<char>>>
                ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                  *)local_1c8,
                 (repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>
                  *)this,loc_01);
      bVar3 = (bool)local_1c8[0];
      if ((bool)local_1c8[0] == true) {
        pvVar7 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                           *)local_1c8);
        region<std::vector<char,_std::allocator<char>_>_>::region(&local_160,pvVar7);
        make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                  (&local_1e8,(detail *)local_160.first_._M_current,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                   local_160.last_._M_current,in_RCX);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_a0,&local_1e8,&local_160);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_118,&local_a0);
        __return_storage_ptr__->is_ok_ = true;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
        ::pair(&(__return_storage_ptr__->field_1).succ.value,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_118);
        success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
        ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
                    *)local_118);
        region<std::vector<char,_std::allocator<char>_>_>::~region(&local_a0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
          operator_delete(local_a0.first._M_dataplus._M_p,
                          local_a0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        region<std::vector<char,_std::allocator<char>_>_>::~region(&local_160);
      }
      if ((local_1c8[0] & 1) != 0) {
        region<std::vector<char,_std::allocator<char>_>_>::~region
                  ((region<std::vector<char,_std::allocator<char>_>_> *)(local_1c8 + 8));
      }
      if (bVar3 != false) {
        return __return_storage_ptr__;
      }
      p_Var2 = &local_160.source_.
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      local_160.super_region_base._vptr_region_base = (_func_int **)p_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,"[error] toml::parse_simple_key: ","");
      local_118 = (undefined1  [8])this;
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"the next token is not a simple key","");
      __l._M_len = 1;
      __l._M_array = (iterator)local_118;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_1e8,__l,&local_1e9);
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_1c8,(string *)&local_160,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_1e8,&local_38);
      uVar4 = local_1c8._8_8_;
      local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) {
        local_a0.first.field_2._8_8_ = local_1b8._8_8_;
        local_1c8._0_8_ = local_a0.first._M_dataplus._M_p;
      }
      local_a0.first.field_2._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
      local_a0.first.field_2._M_local_buf[0] = local_1b8._M_local_buf[0];
      local_1c8._8_8_ = (_func_int **)0x0;
      local_1b8._M_local_buf[0] = '\0';
      __return_storage_ptr__->is_ok_ = false;
      paVar1 = &(__return_storage_ptr__->field_1).succ.value.first.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_1 = paVar1;
      if ((pointer)local_1c8._0_8_ == local_a0.first._M_dataplus._M_p) {
        paVar1->_M_allocated_capacity = local_a0.first.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.first.field_2 + 8) =
             local_a0.first.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.first._M_dataplus._M_p =
             (pointer)local_1c8._0_8_;
        (__return_storage_ptr__->field_1).succ.value.first.field_2._M_allocated_capacity =
             local_a0.first.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.first._M_string_length = uVar4;
      local_a0.first._M_string_length = 0;
      local_a0.first.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1b8._M_allocated_capacity._1_7_ << 8;
      local_1c8._0_8_ = &local_1b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38);
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_1e8);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_160.super_region_base._vptr_region_base == p_Var2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_160.super_region_base._vptr_region_base,
                      (ulong)((long)&(local_160.source_.
                                      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      return __return_storage_ptr__;
    }
    pvVar5 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_118);
    pvVar6 = result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_118);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_1c8,&(pvVar5->first).str,&pvVar6->second);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  ::pair(&local_a0,
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
          *)local_1c8);
  __return_storage_ptr__->is_ok_ = true;
  ctx = &local_a0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  ::pair(&(__return_storage_ptr__->field_1).succ.value,&local_a0);
  success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
  ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
              *)&local_a0);
  region<std::vector<char,_std::allocator<char>_>_>::~region(&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    ctx = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
           *)(CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
    operator_delete((void *)local_1c8._0_8_,(ulong)ctx);
  }
  result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup((result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_118,(EVP_PKEY_CTX *)ctx);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<key, region<Container>>, std::string>
parse_simple_key(location<Container>& loc)
{
    if(const auto bstr = parse_basic_string(loc))
    {
        return ok(std::make_pair(bstr.unwrap().first.str, bstr.unwrap().second));
    }
    if(const auto lstr = parse_literal_string(loc))
    {
        return ok(std::make_pair(lstr.unwrap().first.str, lstr.unwrap().second));
    }
    if(const auto bare = lex_unquoted_key::invoke(loc))
    {
        const auto reg = bare.unwrap();
        return ok(std::make_pair(reg.str(), reg));
    }
    return err(format_underline("[error] toml::parse_simple_key: ",
            {{std::addressof(loc), "the next token is not a simple key"}}));
}